

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__pnm_skip_whitespace(stbi__context *s,char *c)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc *psVar4;
  
  psVar1 = s->buffer_start;
LAB_0017be44:
  do {
    if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
      iVar3 = (*(s->io).eof)(s->io_user_data);
      if (iVar3 == 0) goto LAB_0017be6e;
      if (s->read_from_callbacks != 0) goto LAB_0017be5e;
LAB_0017becc:
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar3 = (*(s->io).eof)(s->io_user_data);
        if (iVar3 == 0) goto LAB_0017befe;
        if (s->read_from_callbacks == 0) {
          return;
        }
      }
      if (s->img_buffer_end <= s->img_buffer) {
        return;
      }
LAB_0017befe:
      if (*c != '#') {
        return;
      }
      do {
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0017bf25:
          if (s->img_buffer_end <= s->img_buffer) goto LAB_0017be44;
        }
        else {
          iVar3 = (*(s->io).eof)(s->io_user_data);
          if (iVar3 != 0) {
            if (s->read_from_callbacks != 0) goto LAB_0017bf25;
            goto LAB_0017be44;
          }
        }
        if ((*c == '\n') || (*c == '\r')) goto LAB_0017be44;
        psVar4 = s->img_buffer;
        if (psVar4 < s->img_buffer_end) {
LAB_0017bfb3:
          s->img_buffer = psVar4 + 1;
          sVar2 = *psVar4;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
            if (iVar3 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar1;
              s->img_buffer_end = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar1;
              s->img_buffer_end = psVar1 + iVar3;
            }
            psVar4 = s->img_buffer;
            goto LAB_0017bfb3;
          }
          sVar2 = '\0';
        }
        *c = sVar2;
      } while( true );
    }
LAB_0017be5e:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_0017becc;
LAB_0017be6e:
    if ((4 < (byte)*c - 9) && (*c != 0x20)) goto LAB_0017becc;
    psVar4 = s->img_buffer;
    if (psVar4 < s->img_buffer_end) {
LAB_0017bfed:
      s->img_buffer = psVar4 + 1;
      sVar2 = *psVar4;
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar3 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar1;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar1;
          s->img_buffer_end = psVar1 + iVar3;
        }
        psVar4 = s->img_buffer;
        goto LAB_0017bfed;
      }
      sVar2 = '\0';
    }
    *c = sVar2;
  } while( true );
}

Assistant:

static void     stbi__pnm_skip_whitespace(stbi__context *s, char *c)
{
   for (;;) {
      while (!stbi__at_eof(s) && stbi__pnm_isspace(*c))
         *c = (char) stbi__get8(s);

      if (stbi__at_eof(s) || *c != '#')
         break;

      while (!stbi__at_eof(s) && *c != '\n' && *c != '\r' )
         *c = (char) stbi__get8(s);
   }
}